

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O2

string * draco::LowercaseMimeTypeExtension(string *__return_storage_ptr__,string *mime_type)

{
  long lVar1;
  string sStack_38;
  
  lVar1 = std::__cxx11::string::rfind((char)mime_type,0x2f);
  if ((lVar1 + 1U < 2) || (lVar1 == mime_type->_M_string_length - 1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&sStack_38);
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)mime_type);
    parser::ToLower(__return_storage_ptr__,&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LowercaseMimeTypeExtension(const std::string &mime_type) {
  const size_t pos = mime_type.find_last_of('/');
  if (pos == 0 || pos == std::string::npos || pos == mime_type.length() - 1) {
    return "";
  }
  return parser::ToLower(mime_type.substr(pos + 1));
}